

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O0

void __thiscall check_construction_of_landscape::test_method(check_construction_of_landscape *this)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_short dimension;
  lazy_ostream *prev;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e8;
  assertion_result local_c8;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  undefined1 local_90 [8];
  Persistence_landscape_on_grid g;
  undefined1 local_48 [8];
  Persistence_landscape_on_grid l;
  check_construction_of_landscape *this_local;
  
  l.number_of_functions_for_projections_to_reals = (size_t)this;
  dimension = std::numeric_limits<unsigned_short>::max();
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_48,"data/file_with_diagram_1",100,dimension);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::print_to_file
            ((Persistence_landscape_on_grid *)local_48,"landscape_from_file_with_diagram_1");
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_90);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
            ((Persistence_landscape_on_grid *)local_90,"landscape_from_file_with_diagram_1");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
               ,0x91);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a0,0x20,&local_b0);
    bVar2 = Gudhi::Persistence_representations::Persistence_landscape_on_grid::operator==
                      ((Persistence_landscape_on_grid *)local_48,
                       (Persistence_landscape_on_grid *)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_c8,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_f8,"l == g",6);
    boost::unit_test::operator<<(&local_e8,prev,&local_f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
               ,0x91);
    boost::test_tools::tt_detail::report_assertion(&local_c8,&local_e8,&local_108,0x20,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e8);
    boost::test_tools::assertion_result::~assertion_result(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::~Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_90);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::~Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_48);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape) {
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  l.print_to_file("landscape_from_file_with_diagram_1");

  Persistence_landscape_on_grid g;
  g.load_landscape_from_file("landscape_from_file_with_diagram_1");

  BOOST_CHECK(l == g);
}